

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

uint32_t Assimp::ComputeMaterialHash(aiMaterial *mat,bool includeMatName)

{
  aiMaterialProperty *paVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (mat->mNumProperties == 0) {
    uVar2 = 0x5df;
  }
  else {
    uVar2 = 0x5df;
    uVar4 = 0;
    do {
      paVar1 = mat->mProperties[uVar4];
      if ((paVar1 != (aiMaterialProperty *)0x0) &&
         ((includeMatName || ((paVar1->mKey).data[0] != '?')))) {
        uVar2 = SuperFastHash((paVar1->mKey).data,(paVar1->mKey).length,uVar2);
        uVar2 = SuperFastHash(paVar1->mData,paVar1->mDataLength,uVar2);
        uVar3 = (ushort)paVar1->mSemantic + uVar2;
        uVar3 = uVar3 * 0x10000 ^
                ((uint)*(byte *)((long)&paVar1->mSemantic + 3) << 0x13 |
                (uint)*(byte *)((long)&paVar1->mSemantic + 2) << 0xb) ^ uVar3;
        uVar3 = (uVar3 >> 0xb) + uVar3;
        uVar3 = uVar3 * 8 ^ uVar3;
        uVar3 = (uVar3 >> 5) + uVar3;
        uVar3 = uVar3 * 0x10 ^ uVar3;
        uVar3 = (uVar3 >> 0x11) + uVar3;
        uVar3 = uVar3 * 0x2000000 ^ uVar3;
        uVar3 = (uVar3 >> 6) + (ushort)paVar1->mIndex + uVar3;
        uVar3 = uVar3 * 0x10000 ^
                ((uint)*(byte *)((long)&paVar1->mIndex + 3) << 0x13 |
                (uint)*(byte *)((long)&paVar1->mIndex + 2) << 0xb) ^ uVar3;
        uVar3 = (uVar3 >> 0xb) + uVar3;
        uVar3 = uVar3 * 8 ^ uVar3;
        uVar3 = (uVar3 >> 5) + uVar3;
        uVar3 = uVar3 * 0x10 ^ uVar3;
        uVar3 = (uVar3 >> 0x11) + uVar3;
        uVar3 = uVar3 * 0x2000000 ^ uVar3;
        uVar2 = (uVar3 >> 6) + uVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < mat->mNumProperties);
  }
  return uVar2;
}

Assistant:

uint32_t Assimp::ComputeMaterialHash(const aiMaterial* mat, bool includeMatName /*= false*/)
{
    uint32_t hash = 1503; // magic start value, chosen to be my birthday :-)
    for ( unsigned int i = 0; i < mat->mNumProperties; ++i ) {
        aiMaterialProperty* prop;

        // Exclude all properties whose first character is '?' from the hash
        // See doc for aiMaterialProperty.
        if ((prop = mat->mProperties[i]) && (includeMatName || prop->mKey.data[0] != '?'))  {

            hash = SuperFastHash(prop->mKey.data,(unsigned int)prop->mKey.length,hash);
            hash = SuperFastHash(prop->mData,prop->mDataLength,hash);

            // Combine the semantic and the index with the hash
            hash = SuperFastHash((const char*)&prop->mSemantic,sizeof(unsigned int),hash);
            hash = SuperFastHash((const char*)&prop->mIndex,sizeof(unsigned int),hash);
        }
    }
    return hash;
}